

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fiord(mcmcxdef *mctx,voccxdef *vctx,tokcxdef *tctx,char *fname,char *exename,
          fiolcxdef *setupctx,objnum *preinit,uint *flagp,tokpdef *path,uchar **fmtsp,uint *fmtlp,
          uint *pcntptr,int flags,appctxdef *appctx,char *argv0)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  mcmon clinum;
  dbgcxdef *pdVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int resfileno;
  int iVar8;
  size_t sVar9;
  FILE *pFVar10;
  ulong uVar11;
  size_t sVar12;
  uchar *puVar13;
  tokthdef *symtab1;
  byte *pbVar14;
  ushort *__ptr;
  size_t sVar15;
  long lVar16;
  runxdef *prVar17;
  char *filename;
  char *pcVar18;
  ulong uVar19;
  uint seed;
  ulong uVar20;
  uint inc;
  ulong __off;
  errcxdef *ctx;
  char *pcVar21;
  ushort *puVar22;
  byte *pbVar23;
  uint uVar24;
  uint siz;
  mclhd loadhd;
  ushort *__ptr_00;
  byte *pbVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  char suffix_uc [4];
  char suffix_lc [4];
  byte local_11c8;
  uint local_11c7 [3];
  undefined1 local_11bb [83];
  char resname [4096];
  errdef fr_;
  
  *preinit = 0xffff;
  pcVar18 = fname;
  if (fname == (char *)0x0) {
    pcVar18 = exename;
  }
  if (pcVar18 == (char *)0x0) {
    G_os_gamename[0] = '\0';
  }
  else {
    sVar9 = strlen(pcVar18);
    sVar12 = 0xfff;
    if (sVar9 < 0xfff) {
      sVar12 = sVar9;
    }
    memcpy(G_os_gamename,pcVar18,sVar12);
    G_os_gamename[sVar12] = '\0';
  }
  if (fname == (char *)0x0) {
    pFVar10 = (FILE *)os_exeseek(exename,"TGAM");
  }
  else {
    pFVar10 = fopen(fname,"rb");
  }
  if (pFVar10 == (FILE *)0x0) {
    errsigf(vctx->voccxerr,"TADS",0x25e);
  }
  if ((appctx != (appctxdef *)0x0) && (appctx->set_game_name != (_func_void_void_ptr_char_ptr *)0x0)
     ) {
    (*appctx->set_game_name)(appctx->set_game_name_ctx,pcVar18);
  }
  uVar11 = ftell(pFVar10);
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode != 0) {
    vctx->voccxerr->errcxptr = fr_.errprv;
    fclose(pFVar10);
    errrse1(vctx->voccxerr,&fr_);
  }
  fr_.errprv = vctx->voccxerr->errcxptr;
  vctx->voccxerr->errcxptr = &fr_;
  ctx = vctx->voccxerr;
  setupctx->fiolcxfp = (osfildef *)pFVar10;
  setupctx->fiolcxerr = ctx;
  setupctx->fiolcxst = uVar11;
  setupctx->fiolcxseed = 0x11;
  setupctx->fiolcxinc = 0x1d;
  sVar12 = fread(resname,0x16,1,pFVar10);
  if (sVar12 == 1) {
    iVar6 = bcmp(resname,"TADS2 bin\n\r\x1a",0xd);
    if (iVar6 != 0) {
      errsigf(ctx,"TADS",0x260);
    }
    pcVar21 = resname + 0xd;
    iVar6 = bcmp(pcVar21,"v2.2.0",7);
    if (((iVar6 != 0) && (iVar6 = bcmp(pcVar21,"v2.0.0",7), iVar6 != 0)) &&
       (iVar6 = bcmp(pcVar21,"v2.0.1",7), iVar6 != 0)) {
LAB_0021485f:
      errsigf(ctx,"TADS",0x263);
    }
    sVar12 = fread(vctx->voccxtim,0x1a,1,pFVar10);
    if (sVar12 == 1) {
      iVar6 = bcmp(pcVar21,"v2.0.0",7);
      if ((iVar6 == 0) || (iVar6 = bcmp(pcVar21,"v2.0.1",7), iVar6 == 0)) {
        *(byte *)&mctx->mcmcxflg = (byte)mctx->mcmcxflg | 1;
      }
      *flagp = resname._20_4_ & 0xffff;
      setupctx->fiolcxflg = resname._20_4_ & 0xffff;
      seed = 0x11;
      inc = 0x1d;
      uVar27 = 0;
      __off = 0;
LAB_00212d27:
      uVar26 = uVar27;
      pcVar21 = resname + 1;
LAB_00212d41:
      sVar12 = fread(resname,1,1,pFVar10);
      if ((sVar12 != 1) ||
         (sVar12 = fread(pcVar21,(ulong)(byte)resname[0] + 4,1,pFVar10), sVar12 != 1))
      goto LAB_0021475c;
      if (5 < (byte)resname[0] - 3) goto switchD_00212db2_caseD_5;
      uVar24 = *(uint *)(resname + (ulong)(byte)resname[0] + 1);
      uVar19 = (ulong)uVar24;
      uVar27 = uVar26;
      switch((uint)(byte)resname[0]) {
      case 3:
        iVar6 = bcmp(pcVar21,"OBJ",3);
        if (iVar6 == 0) {
          if ((*flagp & 0x20) != 0) goto LAB_00212ee5;
          lVar16 = ftell(pFVar10);
          loadhd = lVar16 - uVar11;
          goto LAB_00213658;
        }
        iVar6 = bcmp(pcVar21,"FST",3);
        if (iVar6 != 0) {
          iVar6 = bcmp(pcVar21,"INH",3);
          if (iVar6 == 0) {
            lVar16 = ftell(pFVar10);
            uVar26 = lVar16 - uVar11;
            sVar12 = uVar19 - uVar26;
            if ((0xfffffffd < sVar12 - 1) ||
               (pbVar14 = (byte *)malloc(sVar12), uVar20 = sVar12, pbVar25 = pbVar14,
               pbVar14 == (byte *)0x0)) goto LAB_00213cd3;
            goto LAB_00213364;
          }
          iVar6 = bcmp(pcVar21,"REQ",3);
          if (iVar6 != 0) {
            iVar6 = bcmp(pcVar21,"VOC",3);
            if (iVar6 == 0) {
              lVar16 = ftell(pFVar10);
              uVar26 = lVar16 - uVar11;
              sVar12 = uVar19 - uVar26;
              if ((0xfffffffd < sVar12 - 1) ||
                 (__ptr = (ushort *)malloc(sVar12), uVar20 = sVar12, __ptr_00 = __ptr,
                 __ptr == (ushort *)0x0)) goto LAB_00213e78;
              goto LAB_002138de;
            }
            iVar6 = bcmp(pcVar21,"SRC",3);
            if (iVar6 == 0) {
              if (vctx->voccxrun->runcxdbg == (dbgcxdef *)0x0) goto LAB_00212ee5;
              goto LAB_002139b9;
            }
            iVar6 = bcmp(pcVar21,"XSI",3);
            if (iVar6 != 0) break;
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            seed = (uint)(byte)resname[0];
            setupctx->fiolcxseed = seed;
            inc = (uint)(byte)resname[1];
            setupctx->fiolcxinc = inc;
            fseek(pFVar10,uVar19 + uVar11,0);
            goto LAB_00212d27;
          }
          lVar16 = ftell(pFVar10);
          uVar24 = ((int)uVar11 - (int)lVar16) + uVar24;
          sVar12 = fread(resname,(ulong)uVar24,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          vctx->voccxme_init = CONCAT11(resname[1],resname[0]);
          vctx->voccxme = CONCAT11(resname[1],resname[0]);
          vctx->voccxvtk = CONCAT11(resname[3],resname[2]);
          vctx->voccxstr = CONCAT11(resname[5],resname[4]);
          vctx->voccxnum =
               (short)(CONCAT13(resname[7],CONCAT12(resname[6],CONCAT11(resname[5],resname[4]))) >>
                      0x10);
          vctx->voccxprd = CONCAT11(resname[9],resname[8]);
          *(undefined4 *)&vctx->voccxvag = resname._10_4_;
          vctx->voccxpre = resname._14_2_;
          vctx->voccxper = resname._16_2_;
          if ((int)uVar24 < 0x14) {
            vctx->voccxprom = 0xffff;
LAB_00213d17:
            vctx->voccxpdis = 0xffff;
            vctx->voccxper2 = 0xffff;
            vctx->voccxpdef = 0xffff;
LAB_00213d28:
            vctx->voccxpask = 0xffff;
LAB_00213d31:
            vctx->voccxppc = 0xffff;
LAB_00213d3a:
            vctx->voccxpask2 = 0xffff;
LAB_00213d43:
            vctx->voccxperp = 0xffff;
LAB_00213d4c:
            vctx->voccxpostprom = 0xffff;
            vctx->voccxinitrestore = 0xffff;
LAB_00213d5e:
            vctx->voccxpuv = 0xffff;
            vctx->voccxpnp = 0xffff;
LAB_00213d66:
            vctx->voccxpostact = 0xffff;
            vctx->voccxprecmd = 0xffff;
            vctx->voccxendcmd = 0xffff;
LAB_00213d77:
            vctx->voccxpask3 = 0xffff;
          }
          else {
            vctx->voccxprom = resname._18_2_;
            if (uVar24 < 0x1a) goto LAB_00213d17;
            *(undefined4 *)&vctx->voccxpdis = resname._20_4_;
            vctx->voccxpdef = resname._24_2_;
            if (uVar24 < 0x1c) goto LAB_00213d28;
            vctx->voccxpask = resname._26_2_;
            if (uVar24 < 0x1e) goto LAB_00213d31;
            vctx->voccxppc = resname._28_2_;
            if (uVar24 < 0x20) goto LAB_00213d3a;
            vctx->voccxpask2 = resname._30_2_;
            if (uVar24 < 0x22) goto LAB_00213d43;
            vctx->voccxperp = resname._32_2_;
            if (uVar24 < 0x26) goto LAB_00213d4c;
            vctx->voccxpostprom = resname._34_2_;
            vctx->voccxinitrestore = resname._36_2_;
            if (uVar24 < 0x2a) goto LAB_00213d5e;
            *(undefined4 *)&vctx->voccxpuv = resname._38_4_;
            if (uVar24 < 0x30) goto LAB_00213d66;
            vctx->voccxpostact = resname._42_2_;
            auVar28 = pshuflw(ZEXT416((uint)resname._44_4_),ZEXT416((uint)resname._44_4_),0xe1);
            vctx->voccxprecmd = (short)auVar28._0_4_;
            vctx->voccxendcmd = (short)((uint)auVar28._0_4_ >> 0x10);
            if (uVar24 < 0x32) goto LAB_00213d77;
            vctx->voccxpask3 = resname._48_2_;
            if (0x35 < uVar24) {
              vctx->voccxpre2 = resname._50_2_;
              vctx->voccxpdef2 = resname._52_2_;
              goto LAB_00212d27;
            }
          }
          vctx->voccxpre2 = 0xffff;
          vctx->voccxpdef2 = 0xffff;
          goto LAB_00212d27;
        }
        if ((*flagp & 0x20) != 0) {
          lVar16 = ftell(pFVar10);
          uVar27 = lVar16 - uVar11;
          sVar12 = uVar19 - uVar27;
          if ((0xfffffffd < sVar12 - 1) ||
             (pbVar14 = (byte *)malloc(sVar12), uVar20 = sVar12, pbVar25 = pbVar14,
             pbVar14 == (byte *)0x0)) goto LAB_002141ec;
          goto LAB_00213ad3;
        }
LAB_00212ee5:
        fseek(pFVar10,uVar19 + uVar11,0);
        goto LAB_00212d41;
      case 4:
        if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) == 0x4e434658)
        {
          if (vctx->voccxrun->runcxext == (runxdef *)0x0) goto LAB_002147e0;
          sVar12 = fread(resname,3,1,pFVar10);
          if ((sVar12 != 1) ||
             (sVar12 = fread(resname + 3,(ulong)(byte)resname[2],1,pFVar10), sVar12 != 1))
          goto LAB_0021475c;
        }
        else {
          if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) ==
              0x44504d43) {
            sVar12 = fread(resname,2,1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            vctx->voccxcpl = (uint)CONCAT11(resname[1],resname[0]);
            puVar13 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1");
            vctx->voccxcpp = (char *)puVar13;
            sVar12 = fread(puVar13,(ulong)(uint)vctx->voccxcpl,1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            if ((*flagp & 8) != 0) {
              puVar13 = (uchar *)vctx->voccxcpp;
              uVar7 = vctx->voccxcpl;
              goto LAB_00213003;
            }
            goto LAB_00212d27;
          }
          if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
              0x32435253) {
            if (CONCAT13(resname[4],CONCAT12(resname[3],CONCAT11(resname[2],resname[1]))) !=
                0x464f4524) break;
            if (__off != 0) {
              fseek(pFVar10,__off,0);
              __off = 0;
              goto LAB_00212d27;
            }
            if ((appctx == (appctxdef *)0x0) ||
               (appctx->add_resfile == (_func_int_void_ptr_char_ptr *)0x0)) goto LAB_00214730;
            suffix_uc[0] = 'R';
            suffix_uc[1] = 'S';
            suffix_uc[3] = '\0';
            suffix_lc[0] = 'r';
            suffix_lc[1] = 's';
            suffix_lc[3] = '\0';
            iVar6 = 0;
            goto LAB_002144a0;
          }
          pdVar4 = vctx->voccxrun->runcxdbg;
          if (pdVar4 != (dbgcxdef *)0x0) {
            piVar1 = &pdVar4->dbgcxflg;
            *(byte *)piVar1 = (byte)*piVar1 | 0x40;
          }
        }
LAB_00213ed1:
        fseek(pFVar10,uVar19 + uVar11,0);
        goto LAB_00212d27;
      case 5:
        break;
      case 6:
        iVar6 = bcmp(pcVar21,"FMTSTR",6);
        if (iVar6 == 0) {
          sVar12 = fread(resname,2,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          uVar3 = CONCAT11(resname[1],resname[0]);
          puVar13 = mchalo(vctx->voccxerr,(ulong)uVar3,"fiord1");
          sVar12 = fread(puVar13,(ulong)uVar3,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          if ((*flagp & 8) != 0) {
            fioxor(puVar13,(uint)uVar3,seed,inc);
          }
          tiosetfmt(vctx->voccxtio,vctx->voccxrun,puVar13,(uint)uVar3);
          if (fmtsp != (uchar **)0x0) {
            *fmtsp = puVar13;
          }
          if (fmtlp != (uint *)0x0) {
            *fmtlp = (uint)uVar3;
          }
          goto LAB_00212d27;
        }
        iVar6 = bcmp(pcVar21,"SYMTAB",6);
        if (iVar6 == 0) {
          pdVar4 = vctx->voccxrun->runcxdbg;
          if (pdVar4 == (dbgcxdef *)0x0) goto LAB_00212ee5;
          symtab1 = pdVar4->dbgcxtab;
          if (symtab1 == (tokthdef *)0x0) {
            symtab1 = (tokthdef *)mchalo(ctx,0xb50,"fiord:symtab");
            tokthini(ctx,mctx,(toktdef *)symtab1);
            vctx->voccxrun->runcxdbg->dbgcxtab = symtab1;
          }
          while( true ) {
            sVar12 = fread(resname,4,1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            if ((ulong)(byte)resname[0] == 0) break;
            pcVar21 = resname + 4;
            sVar12 = fread(pcVar21,(ulong)(byte)resname[0],1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            resname[(ulong)(byte)resname[0] + 4] = '\0';
            uVar7 = tokhsh(pcVar21);
            (*(symtab1->tokthsc).toktfadd)
                      (&symtab1->tokthsc,pcVar21,(int)resname[0],(int)resname[1],
                       (int)CONCAT11(resname[3],resname[2]),uVar7);
          }
          goto LAB_00212d27;
        }
        iVar6 = bcmp(pcVar21,"ERRMSG",6);
        if (iVar6 == 0) {
          errini(ctx,(osfildef *)pFVar10);
          goto LAB_00213ed1;
        }
        iVar6 = bcmp(pcVar21,"EXTCNT",6);
        if (iVar6 == 0) {
          lVar16 = ftell(pFVar10);
          sVar12 = fread(resname,2,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          uVar3 = CONCAT11(resname[1],resname[0]);
          uVar27 = (ulong)((uint)uVar3 * 0x30 & 0xffff);
          prVar17 = (runxdef *)mchalo(ctx,uVar27,"fiord:runxdef");
          memset(prVar17,0,uVar27);
          vctx->voccxrun->runcxext = prVar17;
          vctx->voccxrun->runcxexc = (uint)uVar3;
          if (5 < (uVar19 + uVar11) - lVar16) {
            sVar12 = fread(resname,4,1,pFVar10);
            if (sVar12 != 1) goto LAB_0021475c;
            uVar26 = (ulong)CONCAT13(resname[3],CONCAT12(resname[2],CONCAT11(resname[1],resname[0]))
                                    );
          }
          fseek(pFVar10,uVar19 + uVar11,0);
          uVar27 = uVar26;
          goto LAB_00212d27;
        }
        iVar6 = bcmp(pcVar21,"PRPCNT",6);
        if (iVar6 == 0) {
          sVar12 = fread(resname,2,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          if (pcntptr != (uint *)0x0) {
            *pcntptr = (uint)CONCAT11(resname[1],resname[0]);
          }
          goto LAB_00212d27;
        }
        iVar6 = bcmp(pcVar21,"TADSPP",6);
        if ((tctx != (tokcxdef *)0x0) && (iVar6 == 0)) {
          tok_read_defines(tctx,(osfildef *)pFVar10,ctx);
          goto LAB_00212d27;
        }
        iVar6 = bcmp(pcVar21,"CHRSET",6);
        if (iVar6 == 0) {
          sVar12 = fread(resname,6,1,pFVar10);
          if (((sVar12 != 1) || (0x28 < (ulong)CONCAT11(resname[5],resname[4]))) ||
             (sVar12 = fread(resname + 6,(ulong)CONCAT11(resname[5],resname[4]),1,pFVar10),
             sVar12 != 1)) goto LAB_0021475c;
          resname[4] = '\0';
          cmap_set_game_charset(ctx,resname,resname + 6,argv0);
          goto LAB_00212d27;
        }
        break;
      case 7:
        iVar6 = bcmp(pcVar21,"HTMLRES",7);
        if (iVar6 == 0) {
          fiordhtml(ctx,(osfildef *)pFVar10,appctx,0,pcVar18);
          goto LAB_00213ed1;
        }
        iVar6 = bcmp(pcVar21,"PREINIT",7);
        if (iVar6 == 0) {
          sVar12 = fread(resname,2,1,pFVar10);
          if (sVar12 != 1) goto LAB_0021475c;
          *preinit = CONCAT11(resname[1],resname[0]);
          goto LAB_00212d27;
        }
        break;
      case 8:
        goto switchD_00212db2_caseD_8;
      }
      goto switchD_00212db2_caseD_5;
    }
  }
LAB_0021475c:
  errsigf(ctx,"TADS",0x25f);
switchD_00212db2_caseD_8:
  if (CONCAT17(resname[8],
               CONCAT16(resname[7],
                        CONCAT15(resname[6],
                                 CONCAT14(resname[5],
                                          CONCAT13(resname[4],
                                                   CONCAT12(resname[3],
                                                            CONCAT11(resname[2],resname[1]))))))) ==
      0x44524f5743455053) {
    sVar12 = fread(resname,2,1,pFVar10);
    if (sVar12 != 1) goto LAB_0021475c;
    vctx->voccxspl = (uint)CONCAT11(resname[1],resname[0]);
    puVar13 = mchalo(vctx->voccxerr,(ulong)(uint)CONCAT11(resname[1],resname[0]),"fiord1");
    vctx->voccxspp = (char *)puVar13;
    sVar12 = fread(puVar13,(ulong)(uint)vctx->voccxspl,1,pFVar10);
    if (sVar12 != 1) goto LAB_0021475c;
    if ((*flagp & 8) != 0) {
      puVar13 = (uchar *)vctx->voccxspp;
      uVar7 = vctx->voccxspl;
LAB_00213003:
      fioxor(puVar13,uVar7,seed,inc);
    }
    goto LAB_00212d27;
  }
switchD_00212db2_caseD_5:
  goto LAB_002147c7;
LAB_002144a0:
  if (iVar6 == 9) {
LAB_00214730:
    vctx->voccxerr->errcxptr = fr_.errprv;
    return;
  }
  pcVar21 = appctx->ext_res_path;
  if (pcVar21 == (char *)0x0) {
    if (pcVar18 == (char *)0x0) {
      resname[0] = '\0';
    }
    else {
      strcpy(resname,pcVar18);
    }
  }
  else {
    filename = os_get_root_name(pcVar18);
    os_build_full_path(resname,0x1000,pcVar21,filename);
  }
  os_remext(resname);
  suffix_uc[2] = (byte)iVar6 | 0x30;
  suffix_lc[2] = suffix_uc[2];
  os_addext(resname,suffix_lc);
  pFVar10 = fopen(resname,"rb");
  if (pFVar10 == (FILE *)0x0) {
    os_remext(resname);
    os_addext(resname,suffix_uc);
    pFVar10 = fopen(resname,"rb");
    if (pFVar10 != (FILE *)0x0) goto LAB_00214551;
  }
  else {
LAB_00214551:
    resfileno = (*appctx->add_resfile)(appctx->add_resfile_ctx,resname);
    ctx = vctx->voccxerr;
    lVar16 = ftell(pFVar10);
    sVar12 = fread(&local_11c8,0x16,1,pFVar10);
    if (sVar12 != 1) {
LAB_00214774:
      sVar12 = strlen(resname);
      pcVar18 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar18;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x26a,"TADS");
    }
    iVar8 = bcmp(&local_11c8,"TADS2 rsc\n\r\x1a",0xd);
    if (iVar8 != 0) {
      sVar12 = strlen(resname);
      pcVar18 = errstr(ctx,resname,(int)sVar12);
      ctx->errcxptr->erraav[0].errastr = pcVar18;
      ctx->errcxptr->erraac = 1;
      errsign(ctx,0x269,"TADS");
    }
    iVar8 = bcmp(local_11bb,"v2.2.0",7);
    if (((iVar8 != 0) && (iVar8 = bcmp(local_11bb,"v2.0.0",7), iVar8 != 0)) &&
       (iVar8 = bcmp(local_11bb,"v2.0.1",7), iVar8 != 0)) goto LAB_0021485f;
    sVar12 = fread(&local_11c8,0x1a,1,pFVar10);
    if (sVar12 != 1) goto LAB_00214774;
    while( true ) {
      sVar12 = fread(&local_11c8,1,1,pFVar10);
      if ((sVar12 != 1) || (sVar12 = fread(local_11c7,(ulong)local_11c8 + 4,1,pFVar10), sVar12 != 1)
         ) goto LAB_00214774;
      if (local_11c8 != 7) break;
      uVar24 = *(uint *)((long)local_11c7 + (ulong)local_11c8);
      iVar8 = bcmp(local_11c7,"HTMLRES",7);
      if (iVar8 != 0) goto LAB_002147c7;
      fiordhtml(ctx,(osfildef *)pFVar10,appctx,resfileno,resname);
      fseek(pFVar10,(ulong)uVar24 + lVar16,0);
    }
    if ((local_11c8 != 4) || (local_11c7[0] != 0x464f4524)) {
LAB_002147c7:
      errsigf(ctx,"TADS",0x261);
    }
    fclose(pFVar10);
  }
  iVar6 = iVar6 + 1;
  goto LAB_002144a0;
LAB_002141ec:
  if (uVar27 != uVar19) {
    sVar12 = fread(resname,3,1,pFVar10);
    if (sVar12 != 1) goto LAB_0021475c;
    uVar3 = CONCAT11(resname[2],resname[1]);
    if ((byte)resname[0] - 1 < 2) {
      sVar12 = fread(resname + 3,8,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,
              (ulong)CONCAT13(resname[10],CONCAT12(resname[9],CONCAT11(resname[8],resname[7]))));
      uVar27 = uVar27 + 0xb;
      if ((flags & 2U) != 0) {
        mcmlck(mctx,uVar3);
        mcmunlck(mctx,uVar3);
        fseek(pFVar10,uVar27 + uVar11,0);
      }
    }
    else {
      if ((byte)resname[0] != 10) goto LAB_002147f6;
      prVar17 = vctx->voccxrun->runcxext;
      if (prVar17 == (runxdef *)0x0) goto LAB_002147e0;
      sVar12 = fread(resname + 3,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      prVar17 = prVar17 + uVar3;
      sVar12 = fread(prVar17,(ulong)(byte)resname[3],1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      prVar17->runxnam[(byte)resname[3]] = '\0';
      uVar27 = uVar27 + 4 + (ulong)(byte)resname[3];
    }
    goto LAB_002141ec;
  }
  goto LAB_00214402;
LAB_00213ad3:
  pbVar23 = pbVar14;
  if (uVar20 == 0) goto LAB_002142ef;
  sVar9 = 0xffff;
  if (uVar20 < 0xffff) {
    sVar9 = uVar20;
  }
  sVar15 = fread(pbVar25,sVar9,1,pFVar10);
  if (sVar15 != 1) goto LAB_0021475c;
  uVar20 = uVar20 - sVar9;
  pbVar25 = pbVar25 + sVar9;
  goto LAB_00213ad3;
LAB_002142ef:
  if (sVar12 != 0) {
    clinum = *(mcmon *)(pbVar23 + 1);
    if (*pbVar23 - 1 < 2) {
      mcmrsrv(mctx,*(ushort *)(pbVar23 + 3),clinum,(ulong)*(uint *)(pbVar23 + 7));
      pbVar23 = pbVar23 + 0xb;
      sVar12 = sVar12 - 0xb;
      if ((flags & 2U) != 0) {
        mcmlck(mctx,clinum);
        mcmunlck(mctx,clinum);
      }
    }
    else {
      if (*pbVar23 != 10) goto LAB_002147f6;
      prVar17 = vctx->voccxrun->runcxext;
      if (prVar17 == (runxdef *)0x0) goto LAB_002147e0;
      prVar17 = prVar17 + clinum;
      uVar27 = (ulong)pbVar23[3];
      memcpy(prVar17,pbVar23 + 4,uVar27);
      prVar17->runxnam[uVar27] = '\0';
      sVar12 = sVar12 - (uVar27 + 4);
      pbVar23 = pbVar23 + uVar27 + 4;
    }
    goto LAB_002142ef;
  }
  free(pbVar14);
  fseek(pFVar10,uVar11 + uVar19,0);
LAB_00214402:
  uVar27 = 0;
  if (uVar26 != 0) {
    fseek(pFVar10,uVar26,0);
    uVar27 = uVar26;
    __off = uVar19;
  }
  goto LAB_00212d27;
LAB_00213cd3:
  if (uVar26 == uVar19) goto LAB_00212d27;
  sVar12 = fread(resname,9,1,pFVar10);
  cVar5 = resname[2];
  if (sVar12 != 1) goto LAB_0021475c;
  uVar2 = CONCAT11(resname[8],resname[7]);
  uVar3 = CONCAT11(resname[2],resname[1]);
  if (uVar2 == 0) {
    uVar24 = 0;
  }
  else {
    uVar24 = (uint)uVar2 * 2;
    sVar12 = fread(resname + 9,(ulong)uVar24,1,pFVar10);
    if (sVar12 != 1) goto LAB_0021475c;
  }
  vociadd(vctx,uVar3,CONCAT11(resname[4],resname[3]),(uint)uVar2,(objnum *)(resname + 9),
          (byte)resname[0] | 4);
  (vctx->voccxinh[(byte)cVar5][(ulong)uVar3 & 0xff]->vociu).vocius.vociusilc =
       CONCAT11(resname[6],resname[5]);
  uVar26 = (ulong)uVar24 + 9 + uVar26;
  goto LAB_00213cd3;
LAB_00213364:
  pbVar23 = pbVar14;
  if (uVar20 == 0) goto LAB_00213f5a;
  sVar9 = 0xffff;
  if (uVar20 < 0xffff) {
    sVar9 = uVar20;
  }
  sVar15 = fread(pbVar25,sVar9,1,pFVar10);
  if (sVar15 != 1) goto LAB_0021475c;
  uVar20 = uVar20 - sVar9;
  pbVar25 = pbVar25 + sVar9;
  goto LAB_00213364;
LAB_00213f5a:
  for (; sVar12 != 0; sVar12 = sVar12 - ((ulong)uVar3 * 2 + 9)) {
    uVar3 = *(ushort *)(pbVar23 + 7);
    uVar2 = *(ushort *)(pbVar23 + 1);
    vociadd(vctx,uVar2,*(objnum *)(pbVar23 + 3),(uint)uVar3,(objnum *)(pbVar23 + 9),*pbVar23 | 4);
    (vctx->voccxinh[uVar2 >> 8][(ulong)uVar2 & 0xff]->vociu).vocius.vociusilc =
         *(objnum *)(pbVar23 + 5);
    pbVar23 = pbVar23 + (ulong)uVar3 * 2 + 9;
  }
  free(pbVar14);
  goto LAB_00212d27;
LAB_002139b9:
  lVar16 = ftell(pFVar10);
  if (lVar16 - uVar11 == uVar19) goto LAB_00212d27;
  iVar6 = linfload((osfildef *)pFVar10,vctx->voccxrun->runcxdbg,ctx,path);
  if (iVar6 != 0) goto LAB_0021475c;
  goto LAB_002139b9;
LAB_00213e78:
  if (uVar26 == uVar19) goto LAB_00212d27;
  sVar12 = fread(resname,10,1,pFVar10);
  if (sVar12 != 1) goto LAB_0021475c;
  uVar3 = CONCAT11(resname[1],resname[0]);
  uVar2 = CONCAT11(resname[3],resname[2]);
  uVar24 = (uint)uVar2 + (uint)uVar3;
  sVar12 = fread(resname + 10,(ulong)uVar24,1,pFVar10);
  if (sVar12 != 1) goto LAB_0021475c;
  if ((*flagp & 8) != 0) {
    fioxor((uchar *)(resname + 10),uVar24,seed,inc);
  }
  puVar13 = (uchar *)0x0;
  if (uVar2 != 0) {
    puVar13 = (uchar *)(resname + 10 + uVar3);
  }
  vocadd2(vctx,CONCAT11(resname[5],resname[4]),CONCAT11(resname[7],resname[6]),
          (uint)CONCAT11(resname[9],resname[8]),(uchar *)(resname + 10),(uint)uVar3,puVar13,
          (uint)uVar2);
  uVar26 = uVar26 + uVar24 + 10;
  goto LAB_00213e78;
LAB_002138de:
  puVar22 = __ptr;
  if (uVar20 == 0) goto LAB_00214209;
  sVar9 = 0xffff;
  if (uVar20 < 0xffff) {
    sVar9 = uVar20;
  }
  sVar15 = fread(__ptr_00,sVar9,1,pFVar10);
  if (sVar15 != 1) goto LAB_0021475c;
  uVar20 = uVar20 - sVar9;
  __ptr_00 = (ushort *)((long)__ptr_00 + sVar9);
  goto LAB_002138de;
LAB_00214209:
  for (; sVar12 != 0; sVar12 = sVar12 - ((ulong)siz + 10)) {
    uVar24 = (uint)*puVar22;
    uVar3 = puVar22[1];
    if ((*flagp & 8) == 0) {
      siz = uVar3 + uVar24;
    }
    else {
      siz = uVar3 + uVar24;
      fioxor((uchar *)(puVar22 + 5),siz,seed,inc);
    }
    puVar13 = (uchar *)0x0;
    if (uVar3 != 0) {
      puVar13 = (uchar *)((long)puVar22 + (ulong)uVar24 + 10);
    }
    vocadd2(vctx,puVar22[2],puVar22[3],(uint)puVar22[4],(uchar *)(puVar22 + 5),uVar24,puVar13,
            (uint)uVar3);
    puVar22 = (ushort *)((long)puVar22 + (ulong)siz + 10);
  }
  free(__ptr);
  goto LAB_00212d27;
LAB_00213658:
  if (loadhd != uVar19) {
    sVar12 = fread(resname,3,1,pFVar10);
    if (sVar12 != 1) goto LAB_0021475c;
    uVar3 = CONCAT11(resname[2],resname[1]);
    if ((byte)resname[0] - 1 < 2) {
      sVar12 = fread(resname + 3,4,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      mcmrsrv(mctx,CONCAT11(resname[4],resname[3]),uVar3,loadhd);
      uVar2 = CONCAT11(resname[6],resname[5]);
      if ((flags & 2U) != 0) {
        mcmlck(mctx,uVar3);
        mcmunlck(mctx,uVar3);
      }
      loadhd = loadhd + uVar2 + 7;
      fseek(pFVar10,uVar11 + loadhd,0);
    }
    else if ((byte)resname[0] - 7 < 2) {
      sVar12 = fread(resname + 3,2,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      uVar2 = CONCAT11(resname[4],resname[3]);
      puVar13 = mcmalo0(mctx,uVar2,(mcmon *)0x0,uVar3,0);
      sVar12 = fread(puVar13,(ulong)uVar2,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      mcmunlck(mctx,uVar3);
      loadhd = loadhd + uVar2 + 5;
    }
    else {
      if (resname[0] != '\n') {
LAB_002147f6:
        errsigf(ctx,"TADS",0x262);
      }
      prVar17 = vctx->voccxrun->runcxext;
      if (prVar17 == (runxdef *)0x0) {
LAB_002147e0:
        errsigf(ctx,"TADS",0x266);
      }
      sVar12 = fread(resname + 3,1,1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      prVar17 = prVar17 + uVar3;
      sVar12 = fread(prVar17,(ulong)(byte)resname[3],1,pFVar10);
      if (sVar12 != 1) goto LAB_0021475c;
      prVar17->runxnam[(byte)resname[3]] = '\0';
      loadhd = loadhd + (byte)resname[3] + 4;
    }
    goto LAB_00213658;
  }
  goto LAB_00212d27;
}

Assistant:

void fiord(mcmcxdef *mctx, voccxdef *vctx, tokcxdef *tctx, char *fname,
           char *exename, fiolcxdef *setupctx, objnum *preinit, uint *flagp,
           tokpdef *path, uchar **fmtsp, uint *fmtlp, uint *pcntptr,
           int flags, struct appctxdef *appctx, char *argv0)
{
    osfildef *fp;
    ulong     startofs;
    char     *display_fname;
    
    /* presume there will be no need to run preinit */
    *preinit = MCMONINV;

    /* 
     *   get the display filename - use the real filename if one is
     *   provided, otherwise use the name of the executable file itself 
     */
    display_fname = (fname != 0 ? fname : exename);

    /* save the filename in G_os_gamename */
    if (display_fname != 0)
    {
        size_t copylen;

        /* limit the copy to the buffer size */
        if ((copylen = strlen(display_fname)) > sizeof(G_os_gamename) - 1)
            copylen = sizeof(G_os_gamename) - 1;

        /* save it */
        memcpy(G_os_gamename, display_fname, copylen);
        G_os_gamename[copylen] = '\0';
    }
    else
        G_os_gamename[0] = '\0';
    
    /* open the file and read and check file header */
    fp = (fname != 0 ? osfoprb(fname, OSFTGAME)
                     : os_exeseek(exename, "TGAM"));
    if (fp == 0)
        errsig(vctx->voccxerr, ERR_OPRGAM);

    /* 
     *   we've identified the .GAM file source - tell the host system
     *   about it, if it's interested 
     */
    if (appctx != 0 && appctx->set_game_name != 0)
        (*appctx->set_game_name)(appctx->set_game_name_ctx, display_fname);

    /* remember starting location in file */
    startofs = osfpos(fp);

    ERRBEGIN(vctx->voccxerr)

    /* 
     *   Read the game file.  Note that the .GAM file always has resource
     *   file number zero. 
     */
    fiord1(mctx, vctx, tctx, fp, display_fname,
           setupctx, startofs, preinit, flagp, path,
           fmtsp, fmtlp, pcntptr, flags, appctx, argv0);

    /*
     *   If the host system accepts additional resource files, look for
     *   additional resource files.  These are files in the same directory
     *   as the .GAM file, with the .GAM suffix replaced by suffixes from
     *.  RS0 to .RS9.  
     */
    if (appctx != 0 && appctx->add_resfile != 0)
    {
        char suffix_lc[4];
        char suffix_uc[4];
        int i;
        char *base_name;

        /* use the game or executable filename, as appropriate */
        base_name = display_fname;

        /* build the initial suffixes - try both upper- and lower-case */
        suffix_uc[0] = 'R';
        suffix_uc[1] = 'S';
        suffix_uc[3] = '\0';
        suffix_lc[0] = 'r';
        suffix_lc[1] = 's';
        suffix_lc[3] = '\0';

        /* loop through each possible suffix (.RS0 through .RS9) */
        for (i = 0 ; i < 9 ; ++i)
        {
            char resname[OSFNMAX];
            osfildef *fpres;
            int resfileno;

            /* 
             *   Build the next resource filename.  If there's an explicit
             *   resource path, use it, otherwise use the same directory
             *   that contains the .GAM file. 
             */
            if (appctx->ext_res_path != 0)
            {
                /*
                 *   There's an explicit resource path - append the root
                 *   (filename-only, minus path) portion of the .GAM file
                 *   name to the resource path. 
                 */
                os_build_full_path(resname, sizeof(resname),
                                   appctx->ext_res_path,
                                   os_get_root_name(base_name));
            }
            else
            {
                /* 
                 *   there's no resource path - use the entire .GAM
                 *   filename, including directory, so that we look in the
                 *   same directory that contains the .GAM file 
                 */
                if (base_name != 0)
                    strcpy(resname, base_name);
                else
                    resname[0] = '\0';
            }

            /* add the current extension (replacing any current extension) */
            os_remext(resname);
            suffix_lc[2] = suffix_uc[2] = '0' + i;
            os_addext(resname, suffix_lc);

            /* try opening the file */
            fpres = osfoprb(resname, OSFTGAME);

            /* if that didn't work, try the upper-case name */
            if (fpres == 0)
            {
                /* replace the suffix with the upper-case version */
                os_remext(resname);
                os_addext(resname, suffix_uc);

                /* try again with the new name */
                fpres = osfoprb(resname, OSFTGAME);
            }

            /* if we opened it successfully, read it */
            if (fpres != 0)
            {
                /* tell the host system about it */
                resfileno = (*appctx->add_resfile)
                            (appctx->add_resfile_ctx, resname);

                /* read the file */
                fiordrscext(vctx->voccxerr, fpres, appctx,
                            resfileno, resname);

                /* we're done with the file, so close it */
                osfcls(fpres);
            }
        }
    }

    ERRCLEAN(vctx->voccxerr)
        /* if an error occurs during read, clean up by closing the file */
        osfcls(fp);
    ERRENDCLN(vctx->voccxerr);
}